

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderVertexSpacing.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderVertexSpacing::initTest(TessellationShaderVertexSpacing *this)

{
  bool bVar1;
  int iVar2;
  GLenum GVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TessellationShaderUtils *this_01;
  TestLog *this_02;
  MessageBuilder *pMVar5;
  TestError *this_03;
  reference pvVar6;
  _tessellation_primitive_mode primitive_mode_00;
  _tessellation_shader_vertex_spacing vertex_spacing;
  float *cartesian_vertex_data;
  float *barycentric_vertex_data;
  undefined1 local_308 [4];
  uint n_vertex;
  MessageBuilder local_2f0;
  undefined1 local_170 [8];
  string vs_mode_string;
  string primitive_mode_string;
  undefined1 local_128 [8];
  _run run;
  _tessellation_levels *tess_levels;
  __normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_d0;
  __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
  local_c8;
  _tessellation_levels_set_const_iterator tess_levels_set_iterator;
  _tessellation_shader_vertex_spacing vs_mode;
  uint n_vs_mode;
  undefined1 local_a0 [8];
  _tessellation_levels_set tess_levels_set;
  uint local_80;
  _tessellation_primitive_mode primitive_mode;
  uint n_primitive_mode;
  uint n_primitive_modes;
  _tessellation_primitive_mode primitive_modes [3];
  uint n_vs_modes;
  _tessellation_shader_vertex_spacing vs_modes [4];
  Functions *gl;
  allocator<char> local_31;
  string local_30;
  TessellationShaderVertexSpacing *local_10;
  TessellationShaderVertexSpacing *this_local;
  Functions *gl_00;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  this_01 = (TessellationShaderUtils *)operator_new(0x20);
  TessellationShaderUtils::TessellationShaderUtils(this_01,gl_00,&this->super_TestCaseBase);
  this->m_utils = this_01;
  (*gl_00->genVertexArrays)(1,&this->m_vao_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"Could not generate vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                  ,0x38e);
  (*gl_00->bindVertexArray)(this->m_vao_id);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                  ,0x391);
  (*gl_00->getIntegerv)
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
             &this->m_gl_max_tess_gen_level_value);
  GVar3 = (*gl_00->getError)();
  glu::checkError(GVar3,"glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                  ,0x395);
  stack0xffffffffffffff98 = 0x100000000;
  primitive_modes[1] = 4;
  _n_primitive_mode = 0x100000000;
  primitive_modes[0] = TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;
  local_80 = 0;
  do {
    if (2 < local_80) {
      return;
    }
    tess_levels_set.
    super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (float)(&n_primitive_mode)[local_80];
    std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::vector
              ((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
               local_a0);
    TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
              ((_tessellation_levels_set *)&vs_mode,
               (_tessellation_primitive_mode)
               tess_levels_set.
               super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
               this->m_gl_max_tess_gen_level_value,
               TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES);
    std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
    operator=((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
              local_a0,(vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                        *)&vs_mode);
    std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::~vector
              ((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
               &vs_mode);
    for (tess_levels_set_iterator._M_current._4_4_ = 0;
        tess_levels_set_iterator._M_current._4_4_ < 4;
        tess_levels_set_iterator._M_current._4_4_ = tess_levels_set_iterator._M_current._4_4_ + 1) {
      tess_levels_set_iterator._M_current._0_4_ =
           (float)primitive_modes[(ulong)tess_levels_set_iterator._M_current._4_4_ + 2];
      local_d0._M_current =
           (_tessellation_levels *)
           std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::
           begin((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                  *)local_a0);
      __gnu_cxx::
      __normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
      ::__normal_iterator<glcts::_tessellation_levels*>
                ((__normal_iterator<glcts::_tessellation_levels_const*,std::vector<glcts::_tessellation_levels,std::allocator<glcts::_tessellation_levels>>>
                  *)&local_c8,&local_d0);
      while( true ) {
        tess_levels = (_tessellation_levels *)
                      std::
                      vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                      ::end((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                             *)local_a0);
        bVar1 = __gnu_cxx::operator!=
                          (&local_c8,
                           (__normal_iterator<glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
                            *)&tess_levels);
        if (!bVar1) break;
        run._64_8_ = __gnu_cxx::
                     __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
                     ::operator*(&local_c8);
        _run::_run((_run *)local_128);
        if (((tess_levels_set.
              super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 2.8026e-45) ||
            (tess_levels_set_iterator._M_current._0_4_ != 2.8026e-45)) ||
           ((1.0 < *(float *)run._64_8_ && (1.0 < *(float *)(run._64_8_ + 4))))) {
          local_128 = *(undefined1 (*) [8])run._64_8_;
          run.inner = *(float (*) [2])(run._64_8_ + 8);
          run.outer._0_8_ = *(undefined8 *)(run._64_8_ + 0x10);
          run.outer[2] = tess_levels_set.
                         super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          run.outer[3] = tess_levels_set_iterator._M_current._0_4_;
          run.data_cartesian._0_4_ =
               TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                         (this->m_utils,
                          (_tessellation_primitive_mode)
                          tess_levels_set.
                          super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                          (float *)local_128,run.inner,
                          (_tessellation_shader_vertex_spacing)
                          tess_levels_set_iterator._M_current._0_4_,true);
          if ((uint)run.data_cartesian == 0) {
            TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
                      ((string *)((long)&vs_mode_string.field_2 + 8),
                       (TessellationShaderUtils *)
                       (ulong)(uint)tess_levels_set.
                                    super__Vector_base<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                       primitive_mode_00);
            TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
                      ((string *)local_170,
                       (TessellationShaderUtils *)
                       (ulong)(uint)tess_levels_set_iterator._M_current._0_4_,vertex_spacing);
            this_02 = tcu::TestContext::getLog
                                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)
            ;
            tcu::TestLog::operator<<(&local_2f0,this_02,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar5 = tcu::MessageBuilder::operator<<
                               (&local_2f0,
                                (char (*) [67])
                                "No vertices were generated by tessellator for: inner tess levels:["
                               );
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)local_128);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)(local_128 + 4));
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [23])"], outer tess levels:[")
            ;
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,run.inner);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,run.inner + 1);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,run.outer);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a3caab);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,run.outer + 1);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [20])"], primitive mode: ");
            pMVar5 = tcu::MessageBuilder::operator<<
                               (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)((long)&vs_mode_string.field_2 + 8));
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [19])0x2b12431);
            pMVar5 = tcu::MessageBuilder::operator<<
                               (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_170);
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_2f0);
            this_03 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_03,"Zero vertices were generated by tessellator",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderVertexSpacing.cpp"
                       ,0x3df);
            __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          TessellationShaderUtils::getDataGeneratedByTessellator
                    ((vector<char,_std::allocator<char>_> *)local_308,this->m_utils,
                     (float *)local_128,true,(_tessellation_primitive_mode)run.outer[2],
                     TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
                     (_tessellation_shader_vertex_spacing)run.outer[3],run.inner);
          std::vector<char,_std::allocator<char>_>::operator=
                    ((vector<char,_std::allocator<char>_> *)&run.primitive_mode,
                     (vector<char,_std::allocator<char>_> *)local_308);
          std::vector<char,_std::allocator<char>_>::~vector
                    ((vector<char,_std::allocator<char>_> *)local_308);
          if (run.outer[2] == 1.4013e-45) {
            run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
                 operator_new__((ulong)((uint)run.data_cartesian * 2) << 2);
            for (barycentric_vertex_data._4_4_ = 0;
                barycentric_vertex_data._4_4_ < (uint)run.data_cartesian;
                barycentric_vertex_data._4_4_ = barycentric_vertex_data._4_4_ + 1) {
              pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                                 ((vector<char,_std::allocator<char>_> *)&run.primitive_mode,0);
              TessellationShaderUtils::convertBarycentricCoordinatesToCartesian
                        ((float *)(pvVar6 + (ulong)(barycentric_vertex_data._4_4_ * 3) * 4),
                         (float *)(run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   _16_8_ + (ulong)(barycentric_vertex_data._4_4_ * 2) * 4));
            }
          }
          else {
            run.data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0;
          }
          std::
          vector<glcts::TessellationShaderVertexSpacing::_run,_std::allocator<glcts::TessellationShaderVertexSpacing::_run>_>
          ::push_back(&this->m_runs,(value_type *)local_128);
        }
        _run::~_run((_run *)local_128);
        __gnu_cxx::
        __normal_iterator<const_glcts::_tessellation_levels_*,_std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>_>
        ::operator++(&local_c8,0);
      }
    }
    std::vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_>::~vector
              ((vector<glcts::_tessellation_levels,_std::allocator<glcts::_tessellation_levels>_> *)
               local_a0);
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

void TessellationShaderVertexSpacing::initTest()
{
	/* Skip if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize Utils instance */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_utils = new TessellationShaderUtils(gl, this);

	/* Initialize vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate vertex array object");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &m_gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	const _tessellation_shader_vertex_spacing vs_modes[] = { TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
															 TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_EVEN,
															 TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD,
															 TESSELLATION_SHADER_VERTEX_SPACING_DEFAULT };
	const unsigned int n_vs_modes = sizeof(vs_modes) / sizeof(vs_modes[0]);

	const _tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
															 TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS };
	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);

	/* Iterate through all primitive modes */
	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		/* Generate tessellation level set for current primitive mode */
		_tessellation_levels_set tess_levels_set;

		tess_levels_set = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
			primitive_mode, m_gl_max_tess_gen_level_value,
			TESSELLATION_LEVEL_SET_FILTER_INNER_AND_OUTER_LEVELS_USE_DIFFERENT_VALUES);

		/* Iterate through all vertex spacing modes */
		for (unsigned int n_vs_mode = 0; n_vs_mode < n_vs_modes; ++n_vs_mode)
		{
			_tessellation_shader_vertex_spacing vs_mode = vs_modes[n_vs_mode];

			/* Iterate through all tessellation level combinations */
			for (_tessellation_levels_set_const_iterator tess_levels_set_iterator = tess_levels_set.begin();
				 tess_levels_set_iterator != tess_levels_set.end(); tess_levels_set_iterator++)
			{
				const _tessellation_levels& tess_levels = *tess_levels_set_iterator;
				_run						run;

				/* Skip border cases that this test cannot handle */
				if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS &&
					vs_mode == TESSELLATION_SHADER_VERTEX_SPACING_FRACTIONAL_ODD &&
					(tess_levels.inner[0] <= 1 || tess_levels.inner[1] <= 1))
				{
					continue;
				}

				/* Fill run descriptor */
				memcpy(run.inner, tess_levels.inner, sizeof(run.inner));
				memcpy(run.outer, tess_levels.outer, sizeof(run.outer));

				run.primitive_mode = primitive_mode;
				run.vertex_spacing = vs_mode;

				/* Retrieve vertex data for both passes */
				run.n_vertices = m_utils->getAmountOfVerticesGeneratedByTessellator(
					run.primitive_mode, run.inner, run.outer, run.vertex_spacing, true); /* is_point_mode_enabled */

				if (run.n_vertices == 0)
				{
					std::string primitive_mode_string =
						TessellationShaderUtils::getESTokenForPrimitiveMode(primitive_mode);
					std::string vs_mode_string = TessellationShaderUtils::getESTokenForVertexSpacingMode(vs_mode);

					m_testCtx.getLog() << tcu::TestLog::Message << "No vertices were generated by tessellator for: "
																   "inner tess levels:"
																   "["
									   << run.inner[0] << ", " << run.inner[1] << "]"
																				  ", outer tess levels:"
																				  "["
									   << run.outer[0] << ", " << run.outer[1] << ", " << run.outer[2] << ", "
									   << run.outer[3] << "]"
														  ", primitive mode: "
									   << primitive_mode_string << ", vertex spacing: " << vs_mode_string
									   << tcu::TestLog::EndMessage;

					TCU_FAIL("Zero vertices were generated by tessellator");
				}

				/* Retrieve the data buffers */
				run.data = m_utils->getDataGeneratedByTessellator(
					run.inner, true, /* is_point_mode_enabled */
					run.primitive_mode, TESSELLATION_SHADER_VERTEX_ORDERING_CCW, run.vertex_spacing, run.outer);

				/* 'triangles' tessellation data is expressed in barycentric coordinates. Before we can
				 * continue, we need to convert the data to Euclidean space */
				if (run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
				{
					run.data_cartesian = new float[run.n_vertices * 2 /* components */];

					for (unsigned int n_vertex = 0; n_vertex < run.n_vertices; ++n_vertex)
					{
						const float* barycentric_vertex_data =
							(const float*)(&run.data[0]) + n_vertex * 3;						  /* components */
						float* cartesian_vertex_data = (float*)run.data_cartesian + n_vertex * 2; /* components */

						TessellationShaderUtils::convertBarycentricCoordinatesToCartesian(barycentric_vertex_data,
																						  cartesian_vertex_data);
					}
				} /* if (run.primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) */
				else
				{
					run.data_cartesian = DE_NULL;
				}

				/* Store the run data */
				m_runs.push_back(run);
			} /* for (all tessellation level values ) */
		}	 /* for (all primitive modes) */
	}		  /* for (all vertex spacing modes) */
}